

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

void __thiscall
TasGrid::GridWavelet::evaluateHierarchicalFunctionsGPU
          (GridWavelet *this,double *gpu_x,int cpu_num_x,double *gpu_y)

{
  int iVar1;
  int iVar2;
  AccelerationContext *pAVar3;
  int iVar4;
  pointer pCVar5;
  double *pdVar6;
  double *pdVar7;
  double *gpu_y_local;
  int cpu_num_x_local;
  double *gpu_x_local;
  GridWavelet *this_local;
  
  loadGpuBasis<double>(this);
  pAVar3 = (this->super_BaseCanonicalGrid).acceleration;
  iVar1 = this->order;
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  iVar4 = BaseCanonicalGrid::getNumPoints(&this->super_BaseCanonicalGrid);
  pCVar5 = ::std::
           unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
           ::operator->(&this->gpu_cache);
  pdVar6 = GpuVector<double>::data(&pCVar5->nodes);
  pCVar5 = ::std::
           unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
           ::operator->(&this->gpu_cache);
  pdVar7 = GpuVector<double>::data(&pCVar5->support);
  TasGpu::devalpwpoly<double>
            (pAVar3,iVar1,rule_wavelet,iVar2,cpu_num_x,iVar4,gpu_x,pdVar6,pdVar7,gpu_y);
  return;
}

Assistant:

void GridWavelet::evaluateHierarchicalFunctionsGPU(const double gpu_x[], int cpu_num_x, double *gpu_y) const{
    loadGpuBasis<double>();
    TasGpu::devalpwpoly(acceleration, order, rule_wavelet, num_dimensions, cpu_num_x, getNumPoints(), gpu_x, gpu_cache->nodes.data(), gpu_cache->support.data(), gpu_y);
}